

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteList.c
# Opt level: O0

void Io_WriteCellNet(Abc_Ntk_t *pNtk,char *pFileName)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  int local_38;
  int local_34;
  int k;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj;
  FILE *pFile;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar3 = Abc_NtkIsLogic(pNtk);
  if (iVar3 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteList.c"
                  ,0xe3,"void Io_WriteCellNet(Abc_Ntk_t *, char *)");
  }
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Io_WriteCellNet(): Cannot open the output file \"%s\".\n",pFileName);
  }
  else {
    pcVar2 = pNtk->pName;
    pcVar4 = Extra_TimeStamp();
    fprintf(__stream,"# CellNet file for network \"%s\" written by ABC on %s\n",pcVar2,pcVar4);
    for (local_34 = 0; iVar3 = Abc_NtkPiNum(pNtk), local_34 < iVar3; local_34 = local_34 + 1) {
      pAVar5 = Abc_NtkPi(pNtk,local_34);
      fprintf(__stream,"cell %d is 0\n",(ulong)(uint)pAVar5->Id);
    }
    for (local_34 = 0; iVar3 = Abc_NtkPoNum(pNtk), local_34 < iVar3; local_34 = local_34 + 1) {
      pAVar5 = Abc_NtkPo(pNtk,local_34);
      fprintf(__stream,"cell %d is 1\n",(ulong)(uint)pAVar5->Id);
    }
    for (local_34 = 0; iVar3 = Vec_PtrSize(pNtk->vBoxes), local_34 < iVar3; local_34 = local_34 + 1)
    {
      pAVar5 = Abc_NtkBox(pNtk,local_34);
      iVar3 = Abc_ObjIsLatch(pAVar5);
      if (iVar3 != 0) {
        pAVar5 = Abc_ObjFanin0(pAVar5);
        fprintf(__stream,"cell %d is 2\n",(ulong)(uint)pAVar5->Id);
      }
    }
    for (local_34 = 0; iVar3 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar3; local_34 = local_34 + 1)
    {
      pAVar5 = Abc_NtkObj(pNtk,local_34);
      if ((pAVar5 != (Abc_Obj_t *)0x0) && (iVar3 = Abc_ObjIsNode(pAVar5), iVar3 != 0)) {
        uVar1 = pAVar5->Id;
        iVar3 = Abc_ObjFaninNum(pAVar5);
        fprintf(__stream,"cell %d is %d\n",(ulong)uVar1,(ulong)(iVar3 + 3));
      }
    }
    for (local_34 = 0; iVar3 = Abc_NtkPiNum(pNtk), local_34 < iVar3; local_34 = local_34 + 1) {
      pAVar5 = Abc_NtkPi(pNtk,local_34);
      fprintf(__stream,"net %d  %d 0",(ulong)(uint)pAVar5->Id,(ulong)(uint)pAVar5->Id);
      for (local_38 = 0; iVar3 = Abc_ObjFanoutNum(pAVar5), local_38 < iVar3; local_38 = local_38 + 1
          ) {
        pAVar6 = Abc_ObjFanout(pAVar5,local_38);
        uVar1 = pAVar6->Id;
        iVar3 = Abc_ObjFanoutFaninNum(pAVar6,pAVar5);
        fprintf(__stream,"  %d %d",(ulong)uVar1,(ulong)(iVar3 + 1));
      }
      fprintf(__stream,"\n");
    }
    for (local_34 = 0; iVar3 = Vec_PtrSize(pNtk->vBoxes), local_34 < iVar3; local_34 = local_34 + 1)
    {
      pAVar5 = Abc_NtkBox(pNtk,local_34);
      iVar3 = Abc_ObjIsLatch(pAVar5);
      if (iVar3 != 0) {
        pAVar6 = Abc_ObjFanin0(pAVar5);
        uVar1 = pAVar6->Id;
        pAVar6 = Abc_ObjFanin0(pAVar5);
        fprintf(__stream,"net %d  %d 0",(ulong)uVar1,(ulong)(uint)pAVar6->Id);
        pAVar5 = Abc_ObjFanout0(pAVar5);
        for (local_38 = 0; iVar3 = Abc_ObjFanoutNum(pAVar5), local_38 < iVar3;
            local_38 = local_38 + 1) {
          pAVar6 = Abc_ObjFanout(pAVar5,local_38);
          uVar1 = pAVar6->Id;
          iVar3 = Abc_ObjFanoutFaninNum(pAVar6,pAVar5);
          fprintf(__stream,"  %d %d",(ulong)uVar1,(ulong)(iVar3 + 1));
        }
        fprintf(__stream,"\n");
      }
    }
    for (local_34 = 0; iVar3 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar3; local_34 = local_34 + 1)
    {
      pAVar5 = Abc_NtkObj(pNtk,local_34);
      if ((pAVar5 != (Abc_Obj_t *)0x0) && (iVar3 = Abc_ObjIsNode(pAVar5), iVar3 != 0)) {
        fprintf(__stream,"net %d  %d 0",(ulong)(uint)pAVar5->Id,(ulong)(uint)pAVar5->Id);
        for (local_38 = 0; iVar3 = Abc_ObjFanoutNum(pAVar5), local_38 < iVar3;
            local_38 = local_38 + 1) {
          pAVar6 = Abc_ObjFanout(pAVar5,local_38);
          uVar1 = pAVar6->Id;
          iVar3 = Abc_ObjFanoutFaninNum(pAVar6,pAVar5);
          fprintf(__stream,"  %d %d",(ulong)uVar1,(ulong)(iVar3 + 1));
        }
        fprintf(__stream,"\n");
      }
    }
    fprintf(__stream,"\n");
    fclose(__stream);
  }
  return;
}

Assistant:

void Io_WriteCellNet( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;
    Abc_Obj_t * pObj, * pFanout;
    int i, k;

    assert( Abc_NtkIsLogic(pNtk)  );

    // start the output stream
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteCellNet(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    fprintf( pFile, "# CellNet file for network \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );

    // the only tricky part with writing is handling latches:
    // each latch comes with (a) single-input latch-input node, (b) latch proper, (c) single-input latch-output node
    // we arbitrarily decide to use the interger ID of the latch-input node to represent the latch in the file
    // (this ID is used for both the cell and the net driven by that cell)

    // write the PIs
    Abc_NtkForEachPi( pNtk, pObj, i )
        fprintf( pFile, "cell %d is 0\n", pObj->Id );
    // write the POs
    Abc_NtkForEachPo( pNtk, pObj, i )
        fprintf( pFile, "cell %d is 1\n", pObj->Id );
    // write the latches (use the ID of latch input)
    Abc_NtkForEachLatch( pNtk, pObj, i )
        fprintf( pFile, "cell %d is 2\n", Abc_ObjFanin0(pObj)->Id );
    // write the logic nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        fprintf( pFile, "cell %d is %d\n", pObj->Id, 3+Abc_ObjFaninNum(pObj) );

    // write the nets driven by PIs
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        fprintf( pFile, "net %d  %d 0", pObj->Id, pObj->Id );
        Abc_ObjForEachFanout( pObj, pFanout, k )
            fprintf( pFile, "  %d %d", pFanout->Id, 1 + Abc_ObjFanoutFaninNum(pFanout, pObj) );
	    fprintf( pFile, "\n" );
    }
    // write the nets driven by latches
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        fprintf( pFile, "net %d  %d 0", Abc_ObjFanin0(pObj)->Id, Abc_ObjFanin0(pObj)->Id );
        pObj = Abc_ObjFanout0(pObj);
        Abc_ObjForEachFanout( pObj, pFanout, k )
            fprintf( pFile, "  %d %d", pFanout->Id, 1 + Abc_ObjFanoutFaninNum(pFanout, pObj) );
	    fprintf( pFile, "\n" );
    }
    // write the nets driven by nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        fprintf( pFile, "net %d  %d 0", pObj->Id, pObj->Id );
        Abc_ObjForEachFanout( pObj, pFanout, k )
            fprintf( pFile, "  %d %d", pFanout->Id, 1 + Abc_ObjFanoutFaninNum(pFanout, pObj) );
	    fprintf( pFile, "\n" );
    }

	fprintf( pFile, "\n" );
	fclose( pFile );
}